

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O2

void sanitize_player_loc(chunk *c,player *p)

{
  loc grid;
  loc grid_00;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  loc lVar5;
  loc unaff_R12;
  int iVar6;
  ulong uVar7;
  loc lVar8;
  loc local_38;
  
  local_38 = (loc)loc(1,1);
  lVar8.x = (p->grid).x;
  lVar8.y = (p->grid).y;
  _Var1 = square_in_bounds_fully((chunk_conflict *)c,lVar8);
  if (((_Var1) &&
      (grid.x = (p->grid).x, grid.y = (p->grid).y,
      _Var1 = square_isarrivable((chunk_conflict *)c,grid), _Var1)) &&
     (grid_00.x = (p->grid).x, grid_00.y = (p->grid).y,
     _Var1 = square_isvault((chunk_conflict *)c,grid_00), !_Var1)) {
    return;
  }
  iVar6 = -1000;
  lVar5 = local_38;
  while( true ) {
    if (iVar6 == 0) {
      uVar4 = (long)lVar5 << 0x20;
      uVar7 = (ulong)unaff_R12 & 0xffffffff;
      do {
        do {
          lVar8 = (loc)((ulong)unaff_R12 & 0xffffffff | (long)lVar5 << 0x20);
          _Var1 = square_isempty((chunk_conflict *)c,lVar8);
          if ((_Var1) &&
             (_Var1 = square_isvault((chunk_conflict *)c,lVar8), local_38 = lVar8, !_Var1)) {
            (p->grid).x = unaff_R12.x;
            (p->grid).y = lVar5.x;
            return;
          }
          _Var1 = loc_eq((loc_conflict)lVar8,(loc_conflict)(uVar7 | uVar4));
          if (_Var1) {
            (p->grid).x = local_38.x;
            (p->grid).y = local_38.y;
            return;
          }
          unaff_R12.x = unaff_R12.x + L'\x01';
          unaff_R12.y = L'\0';
        } while (unaff_R12.x < c->width + L'\xffffffff');
        lVar5.x = lVar5.x + L'\x01';
        lVar5.y = L'\0';
        if (c->height + L'\xffffffff' <= lVar5.x) {
          lVar5.x = L'\x01';
          lVar5.y = L'\0';
        }
        unaff_R12.x = L'\x01';
        unaff_R12.y = L'\0';
      } while( true );
    }
    uVar2 = Rand_div(c->width + L'\xffffffff');
    uVar3 = Rand_div(c->height + L'\xffffffff');
    unaff_R12 = (loc)loc(uVar2 + 1,uVar3 + 1);
    lVar5 = (loc)((ulong)unaff_R12 >> 0x20);
    _Var1 = square_isempty((chunk_conflict *)c,unaff_R12);
    if ((_Var1) && (_Var1 = square_isvault((chunk_conflict *)c,unaff_R12), !_Var1)) break;
    iVar6 = iVar6 + 1;
  }
  (p->grid).x = unaff_R12.x;
  (p->grid).y = unaff_R12.y;
  return;
}

Assistant:

static void sanitize_player_loc(struct chunk *c, struct player *p)
{
	struct loc tgrid, igrid, vgrid = loc(1, 1);
	int try = 1000;

	/* TODO potential problem: stairs in vaults? */

	/* Allow direct transfer if target location is teleportable */
	if (square_in_bounds_fully(c, p->grid)
		&& square_isarrivable(c, p->grid)
		&& !square_isvault(c, p->grid)) {
		return;
	}
	/* TODO should use something similar to teleport code, but this will
	 *  do for now as a quick'n dirty fix
	 */
	/* A bunch of random locations */
	while (try) {
		try = try - 1;
		tgrid = loc(randint0(c->width - 1) + 1, randint0(c->height - 1) + 1);
		if (square_isempty(c, tgrid) && !square_isvault(c, tgrid)) {
			p->grid = tgrid;
			return;
		}
	}

	/* That didnt work, use our last try as an intital grid... */
	igrid = tgrid;

	/* ...and do a full loop through the dungeon */
	while (1) {
		if (square_isempty(c, tgrid)) {
			if (!square_isvault(c, tgrid)) {
				/* OK location */
				p->grid = tgrid;
				return;
			}
			/* Vault, but lets remember it just in case */
			vgrid = tgrid;
		}
		/* Oops tried *every* tile... */
		if (loc_eq(tgrid, igrid)) {
			break;
		}
		tgrid.x++;
		if (tgrid.x >= c->width - 1) {
			tgrid.x = 1;
			tgrid.y++;
			if (tgrid.y >= c->height - 1) {
				tgrid.y = 1;
			}
		}
	}

	/* Fallback vault location (or at least a non-crashy square) */
	p->grid = vgrid;
}